

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

bool LargeIntRegMultiply<unsigned_long,_unsigned_int>::RegMultiply
               (uint64_t *a,uint32_t b,uint64_t *pRet)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = *a;
  if (uVar2 >> 0x20 == 0) {
    *pRet = uVar2 * b;
    return true;
  }
  uVar1 = (uVar2 >> 0x20) * (ulong)b;
  *pRet = uVar1;
  if (uVar1 >> 0x20 == 0) {
    uVar3 = (uVar2 & 0xffffffff) * (ulong)b;
    uVar2 = (uVar1 << 0x20) + uVar3;
    *pRet = uVar2;
    return uVar3 <= uVar2;
  }
  return false;
}

Assistant:

static bool RegMultiply( const std::uint64_t& a, std::uint32_t b, std::uint64_t* pRet ) SAFEINT_NOTHROW
    {
#if SAFEINT_USE_INTRINSICS || SAFEINT_HAS_INT128
        return MultiplyUint64( a, (std::uint64_t)b, pRet );
#else
        std::uint32_t aHigh = 0, aLow = 0;

        // Consider that a*b can be broken up into:
        // (aHigh * 2^32 + aLow) * b
        // => (aHigh * b * 2^32) + (aLow * b)

        aHigh = (std::uint32_t)(a >> 32);
        aLow  = (std::uint32_t)a;

        *pRet = 0;

        if(aHigh != 0)
        {
            *pRet = (std::uint64_t)aHigh * (std::uint64_t)b;

            std::uint64_t tmp = 0;

            if((std::uint32_t)(*pRet >> 32) != 0)
                return false;

            *pRet <<= 32;
            tmp = (std::uint64_t)aLow * (std::uint64_t)b;
            *pRet += tmp;

            if(*pRet < tmp)
                return false;

            return true;
        }

        *pRet = (std::uint64_t)aLow * (std::uint64_t)b;
        return true;
#endif
    }